

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

float __thiscall
tcu::Texture1DArrayView::sampleCompareOffset
          (Texture1DArrayView *this,Sampler *sampler,float ref,float s,float t,float lod,
          deInt32 offset)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  int iVar1;
  int iVar2;
  float fVar3;
  IVec2 local_28;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  fVar3 = floorf(t + 0.5);
  iVar1 = (int)fVar3;
  iVar2 = (levels->m_size).m_data[1] + -1;
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  local_28.m_data[1] = 0;
  if (-1 < iVar1) {
    local_28.m_data[1] = iVar2;
  }
  local_28.m_data[0] = offset;
  fVar3 = sampleLevelArray1DCompare(levels,numLevels,sampler,ref,s,lod,&local_28);
  return fVar3;
}

Assistant:

float Texture1DArrayView::sampleCompareOffset (const Sampler& sampler, float ref, float s, float t, float lod, deInt32 offset) const
{
	return sampleLevelArray1DCompare(m_levels, m_numLevels, sampler, ref, s, lod, IVec2(offset, selectLayer(t)));
}